

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::redeclareBuiltinBlock
          (TParseContext *this,TSourceLoc *loc,TTypeList *newTypeList,TString *blockName,
          TString *instanceName,TArraySizes *arraySizes)

{
  TSymbolTable *this_00;
  undefined8 uVar1;
  iterator this_01;
  TTypeList *pTVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  undefined4 extraout_var;
  reference pvVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar11;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer pTVar13;
  pointer pTVar14;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  undefined4 extraout_var_61;
  size_type sVar15;
  ulong uVar16;
  TArraySizes *pTVar17;
  TType *pTVar18;
  long *plVar19;
  EVP_PKEY_CTX *ctx;
  char *local_108;
  const_iterator local_e0;
  TTypeLoc *local_d8;
  int local_cc;
  TType *pTStack_c8;
  int innerDimSize;
  TType *newType;
  TType *oldType;
  __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_b0;
  __normal_iterator<glslang::TTypeLoc_const*,std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>>
  local_a8 [8];
  undefined1 local_a0 [8];
  TSourceLoc memberLoc;
  const_iterator newMember;
  const_iterator cStack_78;
  bool found;
  ulong local_70;
  size_t numOriginalMembersFound;
  iterator member;
  TType *type;
  char *errorName;
  TSymbol *block;
  char *pcStack_40;
  bool builtIn;
  char *feature;
  TArraySizes *arraySizes_local;
  TString *instanceName_local;
  TString *blockName_local;
  TTypeList *newTypeList_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  pcStack_40 = "built-in block redeclaration";
  feature = (char *)arraySizes;
  arraySizes_local = (TArraySizes *)instanceName;
  instanceName_local = blockName;
  blockName_local = (TString *)newTypeList;
  newTypeList_local = (TTypeList *)loc;
  loc_local = (TSourceLoc *)this;
  TParseVersions::profileRequires
            ((TParseVersions *)this,loc,8,0x140,2,(char **)AEP_shader_io_blocks,
             "built-in block redeclaration");
  TParseVersions::profileRequires
            ((TParseVersions *)this,(TSourceLoc *)newTypeList_local,-9,0x19a,
             "GL_ARB_separate_shader_objects",pcStack_40);
  bVar3 = std::operator!=(instanceName_local,"gl_PerVertex");
  if (((((bVar3) && (bVar3 = std::operator!=(instanceName_local,"gl_PerFragment"), bVar3)) &&
       (bVar3 = std::operator!=(instanceName_local,"gl_MeshPerVertexNV"), bVar3)) &&
      ((bVar3 = std::operator!=(instanceName_local,"gl_MeshPerPrimitiveNV"), bVar3 &&
       (bVar3 = std::operator!=(instanceName_local,"gl_MeshPerVertexEXT"), bVar3)))) &&
     (bVar3 = std::operator!=(instanceName_local,"gl_MeshPerPrimitiveEXT"),
     pTVar2 = newTypeList_local, bVar3)) {
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (instanceName_local);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar2,"cannot redeclare block: ","block declaration",pcVar9);
    return;
  }
  if ((arraySizes_local != (TArraySizes *)0x0) &&
     (bVar3 = builtInName(this,(TString *)arraySizes_local), pTVar2 = newTypeList_local, !bVar3)) {
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)arraySizes_local);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar2,"cannot redeclare a built-in block with a user name",pcVar9,"");
    return;
  }
  if (arraySizes_local == (TArraySizes *)0x0) {
    this_00 = (this->super_TParseContextBase).symbolTable;
    pvVar10 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::front
                        ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                         blockName_local);
    iVar6 = (*pvVar10->type->_vptr_TType[6])();
    errorName = (char *)TSymbolTable::find(this_00,(TString *)CONCAT44(extraout_var,iVar6),
                                           (bool *)((long)&block + 7),(bool *)0x0,(int *)0x0);
  }
  else {
    errorName = (char *)TSymbolTable::find((this->super_TParseContextBase).symbolTable,
                                           (TString *)arraySizes_local,(bool *)((long)&block + 7),
                                           (bool *)0x0,(int *)0x0);
  }
  if (arraySizes_local == (TArraySizes *)0x0) {
    pvVar10 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::front
                        ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                         blockName_local);
    iVar6 = (*pvVar10->type->_vptr_TType[6])();
    local_108 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_00,iVar6));
  }
  else {
    local_108 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)arraySizes_local);
  }
  pTVar2 = newTypeList_local;
  if (errorName == (char *)0x0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,newTypeList_local,"no declaration found for redeclaration",local_108,"");
    return;
  }
  if ((block._7_1_ & 1) == 0) {
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (instanceName_local);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar2,"can only redeclare a built-in block once, and before any use",pcVar9,"")
    ;
    return;
  }
  errorName = (char *)TSymbolTable::copyUpDeferredInsert
                                ((this->super_TParseContextBase).symbolTable,(TSymbol *)errorName);
  iVar6 = (*((TSymbol *)errorName)->_vptr_TSymbol[0xc])();
  iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x38))();
  if (iVar6 != 0x10) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,newTypeList_local,"cannot redeclare a non block as a block",local_108,"");
    return;
  }
  if ((((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8 & 0x7f) == 4) &&
     (bVar3 = TQualifier::hasXfbBuffer(&this->globalOutputDefaults), bVar3)) {
    bVar3 = TQualifier::hasXfbBuffer(&this->currentBlockQualifier);
    if (!bVar3) {
      *(ulong *)&(this->currentBlockQualifier).field_0x24 =
           *(ulong *)&(this->currentBlockQualifier).field_0x24 & 0xfffffffffffffff0 |
           (ulong)((uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf);
    }
    bVar3 = TQualifier::hasStream(&this->currentBlockQualifier);
    if (!bVar3) {
      *(ulong *)&(this->currentBlockQualifier).field_0x1c =
           *(ulong *)&(this->currentBlockQualifier).field_0x1c & 0xffffffffffffff |
           *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xff00000000000000;
    }
    fixXfbOffsets(this,&this->currentBlockQualifier,(TTypeList *)blockName_local);
  }
  member._M_current = (TTypeLoc *)(**(code **)(*(long *)errorName + 0x68))();
  if (((this->currentBlockQualifier).layoutPassthrough & 1U) != 0) {
    bVar3 = (this->currentBlockQualifier).layoutPassthrough;
    lVar11 = (*(code *)((member._M_current)->type->qualifier).spirvDecorate)();
    *(byte *)(lVar11 + 0x2f) = bVar3 & 1;
    uVar1 = *(undefined8 *)&(this->currentBlockQualifier).field_0x8;
    lVar11 = (*(code *)((member._M_current)->type->qualifier).spirvDecorate)();
    *(ulong *)(lVar11 + 8) =
         *(ulong *)(lVar11 + 8) & 0xffffffffffffff80 | (ulong)((uint)uVar1 & 0x7f);
    uVar16 = *(ulong *)&(this->currentBlockQualifier).field_0x1c;
    lVar11 = (*(code *)((member._M_current)->type->qualifier).spirvDecorate)();
    *(ulong *)(lVar11 + 0x1c) =
         *(ulong *)(lVar11 + 0x1c) & 0xffffffffffffff | uVar16 & 0xff00000000000000;
    uVar1 = *(undefined8 *)&(this->currentBlockQualifier).field_0x24;
    lVar11 = (*(code *)((member._M_current)->type->qualifier).spirvDecorate)();
    *(ulong *)(lVar11 + 0x24) =
         *(ulong *)(lVar11 + 0x24) & 0xfffffffffffffff0 | (ulong)((uint)uVar1 & 0xf);
  }
  pvVar12 = &TType::getWritableStruct((TType *)member._M_current)->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  numOriginalMembersFound =
       (size_t)std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                         (pvVar12);
  local_70 = 0;
  while( true ) {
    pvVar12 = &TType::getStruct((TType *)member._M_current)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    cStack_78 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::end
                          (pvVar12);
    ctx = (EVP_PKEY_CTX *)&stack0xffffffffffffff88;
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                        *)&numOriginalMembersFound,
                       (__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                        *)ctx);
    if (!bVar3) break;
    bVar3 = false;
    __gnu_cxx::
    __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
    ::__normal_iterator((__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                         *)&memberLoc.column);
    TSourceLoc::init((TSourceLoc *)local_a0,ctx);
    local_b0._M_current =
         (TTypeLoc *)
         std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                   ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                    blockName_local);
    __gnu_cxx::
    __normal_iterator<glslang::TTypeLoc_const*,std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>>
    ::__normal_iterator<glslang::TTypeLoc*>(local_a8,&local_b0);
    memberLoc._16_8_ = local_a8;
    while( true ) {
      oldType = (TType *)std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ::end((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                *)blockName_local);
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                          *)&memberLoc.column,
                         (__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                          *)&oldType);
      if (!bVar4) break;
      pTVar13 = __gnu_cxx::
                __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                              *)&numOriginalMembersFound);
      iVar6 = (*pTVar13->type->_vptr_TType[6])();
      pTVar14 = __gnu_cxx::
                __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                ::operator->((__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                              *)&memberLoc.column);
      iVar8 = (*pTVar14->type->_vptr_TType[6])();
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_02,iVar6),
                              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_03,iVar8));
      if (bVar4) {
        bVar3 = true;
        pTVar14 = __gnu_cxx::
                  __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                  ::operator->((__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                *)&memberLoc.column);
        local_a0 = (undefined1  [8])(pTVar14->loc).name;
        memberLoc.name = *(TString **)&(pTVar14->loc).string;
        memberLoc.string = (pTVar14->loc).column;
        memberLoc.line = *(int *)&(pTVar14->loc).field_0x14;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
      ::operator++((__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                    *)&memberLoc.column);
    }
    if (bVar3) {
      local_70 = local_70 + 1;
      pTVar13 = __gnu_cxx::
                __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                              *)&numOriginalMembersFound);
      newType = pTVar13->type;
      pTVar14 = __gnu_cxx::
                __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                ::operator->((__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                              *)&memberLoc.column);
      pTStack_c8 = pTVar14->type;
      bVar3 = TType::sameElementType(pTStack_c8,newType,(int *)0x0,(int *)0x0);
      if (!bVar3) {
        pTVar13 = __gnu_cxx::
                  __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                  ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                *)&numOriginalMembersFound);
        iVar6 = (*pTVar13->type->_vptr_TType[6])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_04,iVar6));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_a0,"cannot redeclare block member with a different type",pcVar9,"");
      }
      iVar6 = (*newType->_vptr_TType[0x1d])();
      iVar8 = (*pTStack_c8->_vptr_TType[0x1d])();
      if (((byte)iVar6 & 1) == ((byte)iVar8 & 1)) {
        iVar6 = (*newType->_vptr_TType[10])();
        bVar3 = TQualifier::isPerView((TQualifier *)CONCAT44(extraout_var_06,iVar6));
        if (((bVar3) || (bVar3 = TType::sameArrayness(newType,pTStack_c8), bVar3)) ||
           (uVar7 = (*newType->_vptr_TType[0x1e])(), (uVar7 & 1) == 0)) {
          iVar6 = (*newType->_vptr_TType[10])();
          bVar3 = TQualifier::isPerView((TQualifier *)CONCAT44(extraout_var_08,iVar6));
          if ((!bVar3) &&
             (uVar7 = (*pTStack_c8->_vptr_TType[0x1d])(), pTVar2 = newTypeList_local,
             (uVar7 & 1) != 0)) {
            pTVar13 = __gnu_cxx::
                      __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                      ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                    *)&numOriginalMembersFound);
            iVar6 = (*pTVar13->type->_vptr_TType[6])();
            iVar8 = (*pTStack_c8->_vptr_TType[0xf])();
            arrayLimitCheck(this,(TSourceLoc *)pTVar2,(TString *)CONCAT44(extraout_var_09,iVar6),
                            iVar8);
          }
        }
        else {
          pTVar13 = __gnu_cxx::
                    __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                    ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                  *)&numOriginalMembersFound);
          iVar6 = (*pTVar13->type->_vptr_TType[6])();
          pcVar9 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_07,iVar6));
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,local_a0,"cannot change array size of redeclared block member",pcVar9,"");
        }
      }
      else {
        pTVar13 = __gnu_cxx::
                  __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                  ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                *)&numOriginalMembersFound);
        iVar6 = (*pTVar13->type->_vptr_TType[6])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_05,iVar6));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_a0,"cannot change arrayness of redeclared block member",pcVar9,"");
      }
      iVar6 = (*newType->_vptr_TType[10])();
      bVar3 = TQualifier::isPerView((TQualifier *)CONCAT44(extraout_var_10,iVar6));
      if (bVar3) {
        iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
        bVar3 = TQualifier::isPerView((TQualifier *)CONCAT44(extraout_var_11,iVar6));
        if (bVar3) goto LAB_0069913b;
        pTVar13 = __gnu_cxx::
                  __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                  ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                *)&numOriginalMembersFound);
        iVar6 = (*pTVar13->type->_vptr_TType[6])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_12,iVar6));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_a0,"missing perviewNV qualifier to redeclared block member",pcVar9,"")
        ;
      }
      else {
LAB_0069913b:
        iVar6 = (*newType->_vptr_TType[10])();
        bVar3 = TQualifier::isPerView((TQualifier *)CONCAT44(extraout_var_13,iVar6));
        if (!bVar3) {
          iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
          bVar3 = TQualifier::isPerView((TQualifier *)CONCAT44(extraout_var_14,iVar6));
          if (bVar3) {
            pTVar13 = __gnu_cxx::
                      __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                      ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                    *)&numOriginalMembersFound);
            iVar6 = (*pTVar13->type->_vptr_TType[6])();
            pcVar9 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_15,iVar6));
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,local_a0,"cannot add perviewNV qualifier to redeclared block member",
                       pcVar9,"");
            goto LAB_0069935f;
          }
        }
        iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
        bVar3 = TQualifier::isPerView((TQualifier *)CONCAT44(extraout_var_16,iVar6));
        if (bVar3) {
          iVar6 = (*newType->_vptr_TType[0x14])();
          iVar6 = TArraySizes::getNumDims((TArraySizes *)CONCAT44(extraout_var_17,iVar6));
          iVar8 = (*pTStack_c8->_vptr_TType[0x13])();
          iVar8 = TArraySizes::getNumDims((TArraySizes *)CONCAT44(extraout_var_18,iVar8));
          if (iVar6 == iVar8) {
            uVar7 = (*pTStack_c8->_vptr_TType[0x1f])();
            if (((uVar7 & 1) == 0) &&
               (iVar6 = (*pTStack_c8->_vptr_TType[0xf])(),
               iVar6 != (this->resources).maxMeshViewCountNV)) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,newTypeList_local,
                         "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized"
                         ,"[]","");
            }
            else {
              iVar6 = (*pTStack_c8->_vptr_TType[0x13])();
              iVar6 = TArraySizes::getNumDims((TArraySizes *)CONCAT44(extraout_var_20,iVar6));
              if (iVar6 == 2) {
                iVar6 = (*pTStack_c8->_vptr_TType[0x13])();
                local_cc = TArraySizes::getDimSize((TArraySizes *)CONCAT44(extraout_var_21,iVar6),1)
                ;
                pTVar13 = __gnu_cxx::
                          __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                          ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                        *)&numOriginalMembersFound);
                iVar6 = (*pTVar13->type->_vptr_TType[6])();
                arrayLimitCheck(this,(TSourceLoc *)local_a0,
                                (TString *)CONCAT44(extraout_var_22,iVar6),local_cc);
                iVar6 = (*newType->_vptr_TType[0x14])();
                TArraySizes::setDimSize((TArraySizes *)CONCAT44(extraout_var_23,iVar6),1,local_cc);
              }
            }
          }
          else {
            pTVar13 = __gnu_cxx::
                      __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                      ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                    *)&numOriginalMembersFound);
            iVar6 = (*pTVar13->type->_vptr_TType[6])();
            pcVar9 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_19,iVar6));
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,local_a0,"cannot change arrayness of redeclared block member",pcVar9,"")
            ;
          }
        }
      }
LAB_0069935f:
      iVar6 = (*newType->_vptr_TType[10])();
      bVar3 = TQualifier::isPerPrimitive((TQualifier *)CONCAT44(extraout_var_24,iVar6));
      if (bVar3) {
        iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
        bVar3 = TQualifier::isPerPrimitive((TQualifier *)CONCAT44(extraout_var_25,iVar6));
        if (bVar3) goto LAB_006993da;
        pTVar13 = __gnu_cxx::
                  __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                  ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                *)&numOriginalMembersFound);
        iVar6 = (*pTVar13->type->_vptr_TType[6])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_26,iVar6));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_a0,"missing perprimitiveNV qualifier to redeclared block member",
                   pcVar9,"");
      }
      else {
LAB_006993da:
        iVar6 = (*newType->_vptr_TType[10])();
        bVar3 = TQualifier::isPerPrimitive((TQualifier *)CONCAT44(extraout_var_27,iVar6));
        if (!bVar3) {
          iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
          bVar3 = TQualifier::isPerPrimitive((TQualifier *)CONCAT44(extraout_var_28,iVar6));
          if (bVar3) {
            pTVar13 = __gnu_cxx::
                      __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                      ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                    *)&numOriginalMembersFound);
            iVar6 = (*pTVar13->type->_vptr_TType[6])();
            pcVar9 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_29,iVar6));
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,local_a0,
                       "cannot add perprimitiveNV qualifier to redeclared block member",pcVar9,"");
          }
        }
      }
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      bVar3 = TQualifier::isMemory((TQualifier *)CONCAT44(extraout_var_30,iVar6));
      if (bVar3) {
        pTVar13 = __gnu_cxx::
                  __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                  ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                *)&numOriginalMembersFound);
        iVar6 = (*pTVar13->type->_vptr_TType[6])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_31,iVar6));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_a0,"cannot add memory qualifier to redeclared block member",pcVar9,"")
        ;
      }
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      bVar3 = TQualifier::hasNonXfbLayout((TQualifier *)CONCAT44(extraout_var_32,iVar6));
      if (bVar3) {
        pTVar13 = __gnu_cxx::
                  __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                  ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                *)&numOriginalMembersFound);
        iVar6 = (*pTVar13->type->_vptr_TType[6])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_33,iVar6));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_a0,"cannot add non-XFB layout to redeclared block member",pcVar9,"");
      }
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      if ((*(ulong *)(CONCAT44(extraout_var_34,iVar6) + 8) >> 0x2c & 1) != 0) {
        pTVar13 = __gnu_cxx::
                  __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                  ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                *)&numOriginalMembersFound);
        iVar6 = (*pTVar13->type->_vptr_TType[6])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_35,iVar6));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_a0,"cannot add patch to redeclared block member",pcVar9,"");
      }
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      bVar3 = TQualifier::hasXfbBuffer((TQualifier *)CONCAT44(extraout_var_36,iVar6));
      if ((bVar3) &&
         (iVar6 = (*pTStack_c8->_vptr_TType[0xb])(),
         ((uint)*(undefined8 *)(CONCAT44(extraout_var_37,iVar6) + 0x24) & 0xf) !=
         ((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x24 & 0xf))) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_a0,
                   "member cannot contradict block (or what block inherited from global)",
                   "xfb_buffer","");
      }
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      bVar3 = TQualifier::hasStream((TQualifier *)CONCAT44(extraout_var_38,iVar6));
      if ((bVar3) &&
         (iVar6 = (*pTStack_c8->_vptr_TType[0xb])(),
         (char)((ulong)*(undefined8 *)(CONCAT44(extraout_var_39,iVar6) + 0x1c) >> 0x38) !=
         (char)((ulong)*(undefined8 *)&(this->currentBlockQualifier).field_0x1c >> 0x38))) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_a0,
                   "member cannot contradict block (or what block inherited from global)",
                   "xfb_stream","");
      }
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      uVar7 = *(uint *)(CONCAT44(extraout_var_40,iVar6) + 8);
      iVar6 = (*newType->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_41,iVar6) + 8) =
           *(ulong *)(CONCAT44(extraout_var_41,iVar6) + 8) & 0xffffffffdfffffff |
           (ulong)(uVar7 & 0x20000000);
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      uVar16 = *(ulong *)(CONCAT44(extraout_var_42,iVar6) + 8);
      iVar6 = (*newType->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_43,iVar6) + 8) =
           *(ulong *)(CONCAT44(extraout_var_43,iVar6) + 8) & 0xffffdfffffffffff |
           uVar16 & 0x200000000000;
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      uVar7 = *(uint *)(CONCAT44(extraout_var_44,iVar6) + 8);
      iVar6 = (*newType->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_45,iVar6) + 8) =
           *(ulong *)(CONCAT44(extraout_var_45,iVar6) + 8) & 0xffffffffefffffff |
           (ulong)(uVar7 & 0x10000000);
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      uVar16 = *(ulong *)(CONCAT44(extraout_var_46,iVar6) + 8);
      iVar6 = (*newType->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_47,iVar6) + 8) =
           *(ulong *)(CONCAT44(extraout_var_47,iVar6) + 8) & 0xffffffefffffffff |
           uVar16 & 0x1000000000;
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      uVar7 = *(uint *)(CONCAT44(extraout_var_48,iVar6) + 8);
      iVar6 = (*newType->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_49,iVar6) + 8) =
           *(ulong *)(CONCAT44(extraout_var_49,iVar6) + 8) & 0xffffffffbfffffff |
           (ulong)(uVar7 & 0x40000000);
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      uVar7 = *(uint *)(CONCAT44(extraout_var_50,iVar6) + 8);
      iVar6 = (*newType->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_51,iVar6) + 8) =
           *(ulong *)(CONCAT44(extraout_var_51,iVar6) + 8) & 0xffffffff7fffffff |
           (ulong)(uVar7 & 0x80000000);
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      uVar16 = *(ulong *)(CONCAT44(extraout_var_52,iVar6) + 8);
      iVar6 = (*newType->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_53,iVar6) + 8) =
           *(ulong *)(CONCAT44(extraout_var_53,iVar6) + 8) & 0xffffffdfffffffff |
           (ulong)((byte)(uVar16 >> 0x25) & 1) << 0x25;
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      uVar16 = *(ulong *)(CONCAT44(extraout_var_54,iVar6) + 0x24);
      iVar6 = (*newType->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_55,iVar6) + 0x24) =
           *(ulong *)(CONCAT44(extraout_var_55,iVar6) + 0x24) & 0xffffffff8003ffff |
           (ulong)((uint)(uVar16 >> 0x12) & 0x1fff) << 0x12;
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      uVar1 = *(undefined8 *)(CONCAT44(extraout_var_56,iVar6) + 0x24);
      iVar6 = (*newType->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_57,iVar6) + 0x24) =
           *(ulong *)(CONCAT44(extraout_var_57,iVar6) + 0x24) & 0xfffffffffffffff0 |
           (ulong)((uint)uVar1 & 0xf);
      iVar6 = (*pTStack_c8->_vptr_TType[0xb])();
      uVar16 = *(ulong *)(CONCAT44(extraout_var_58,iVar6) + 0x24);
      iVar6 = (*newType->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_59,iVar6) + 0x24) =
           *(ulong *)(CONCAT44(extraout_var_59,iVar6) + 0x24) & 0xfffffffffffc000f |
           (ulong)((uint)(uVar16 >> 4) & 0x3fff) << 4;
      iVar6 = (*newType->_vptr_TType[10])();
      if (((uint)(*(ulong *)(CONCAT44(extraout_var_60,iVar6) + 0x24) >> 0x12) & 0x1fff) != 0xf) {
        uVar1 = *(undefined8 *)&(this->currentBlockQualifier).field_0x24;
        lVar11 = (*(code *)((member._M_current)->type->qualifier).spirvDecorate)();
        *(ulong *)(lVar11 + 0x24) =
             *(ulong *)(lVar11 + 0x24) & 0xfffffffffffffff0 | (ulong)((uint)uVar1 & 0xf);
        uVar1 = *(undefined8 *)&(this->currentBlockQualifier).field_0x24;
        iVar6 = (*newType->_vptr_TType[10])();
        *(ulong *)(CONCAT44(extraout_var_61,iVar6) + 0x24) =
             *(ulong *)(CONCAT44(extraout_var_61,iVar6) + 0x24) & 0xfffffffffffffff0 |
             (ulong)((uint)uVar1 & 0xf);
      }
      uVar7 = (*newType->_vptr_TType[0x1f])();
      if (((uVar7 & 1) != 0) &&
         (uVar7 = (*pTStack_c8->_vptr_TType[0x1e])(), pTVar18 = newType, (uVar7 & 1) != 0)) {
        iVar6 = (*pTStack_c8->_vptr_TType[0xf])();
        TType::changeOuterArraySize(pTVar18,iVar6);
      }
      layoutTypeCheck(this,(TSourceLoc *)newTypeList_local,newType);
      __gnu_cxx::
      __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
      ::operator++((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                    *)&numOriginalMembersFound);
    }
    else if (arraySizes_local == (TArraySizes *)0x0) {
      pTVar13 = __gnu_cxx::
                __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                ::operator->((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                              *)&numOriginalMembersFound);
      (*pTVar13->type->_vptr_TType[2])();
      __gnu_cxx::
      __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
      ::operator++((__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                    *)&numOriginalMembersFound);
    }
    else {
      pvVar12 = &TType::getWritableStruct((TType *)member._M_current)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      __gnu_cxx::
      __normal_iterator<glslang::TTypeLoc_const*,std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>>
      ::__normal_iterator<glslang::TTypeLoc*>
                ((__normal_iterator<glslang::TTypeLoc_const*,std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>>
                  *)&local_e0,
                 (__normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                  *)&numOriginalMembersFound);
      local_d8 = (TTypeLoc *)
                 std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::erase
                           (pvVar12,local_e0);
      numOriginalMembersFound = (size_t)local_d8;
    }
  }
  if (0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) {
    uVar16 = *(ulong *)&(this->currentBlockQualifier).field_0x1c;
    lVar11 = (*(code *)((member._M_current)->type->qualifier).spirvDecorate)();
    *(ulong *)(lVar11 + 0x1c) =
         *(ulong *)(lVar11 + 0x1c) & 0xffffffffffffff | uVar16 & 0xff00000000000000;
  }
  uVar16 = local_70;
  sVar15 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                     ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                      blockName_local);
  pTVar2 = newTypeList_local;
  if (uVar16 < sVar15) {
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (instanceName_local);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar2,"block redeclaration has extra members",pcVar9,"");
  }
  bVar5 = (*(code *)(member._M_current)->type[1].qualifier.spirvDecorate)();
  if ((bool)(bVar5 & 1) == (feature != (char *)0x0)) {
    uVar16 = (*(code *)(member._M_current)->type[1].qualifier.spirvDecorate)();
    if (((uVar16 & 1) != 0) && (feature != (char *)0x0)) {
      pTVar17 = (TArraySizes *)(**(code **)&(member._M_current)->type[1].field_0x8)();
      iVar6 = TArraySizes::getNumDims(pTVar17);
      iVar8 = TArraySizes::getNumDims((TArraySizes *)feature);
      if (iVar6 != iVar8) goto LAB_00699c36;
    }
    uVar16 = (*(code *)(member._M_current)->type[1].qualifier.spirvDecorate)();
    if ((uVar16 & 1) != 0) {
      bVar3 = TArraySizes::isSized((TArraySizes *)feature);
      if ((!bVar3) &&
         (uVar16 = (**(code **)&(member._M_current)->type[1].qualifier.layoutBindlessSampler)(),
         pcVar9 = feature, (uVar16 & 1) != 0)) {
        iVar6 = (*(code *)(member._M_current)->type->typeName)();
        TArraySizes::changeOuterSize((TArraySizes *)pcVar9,iVar6);
      }
      uVar16 = (**(code **)&(member._M_current)->type[1].qualifier.layoutBindlessSampler)();
      if (((uVar16 & 1) == 0) &&
         (bVar3 = TArraySizes::isSized((TArraySizes *)feature), this_01 = member, bVar3)) {
        iVar6 = TArraySizes::getOuterSize((TArraySizes *)feature);
        TType::changeOuterArraySize((TType *)this_01._M_current,iVar6);
      }
      uVar16 = (**(code **)&(member._M_current)->type[1].qualifier.layoutBindlessSampler)();
      if ((uVar16 & 1) != 0) {
        pTVar17 = (TArraySizes *)(**(code **)&(member._M_current)->type[1].field_0x8)();
        bVar3 = TArraySizes::operator!=(pTVar17,(TArraySizes *)feature);
        pTVar2 = newTypeList_local;
        if (bVar3) {
          pcVar9 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (instanceName_local);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar2,"cannot change array size of redeclared block",pcVar9,"");
        }
      }
    }
  }
  else {
LAB_00699c36:
    pTVar2 = newTypeList_local;
    pcVar9 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (instanceName_local);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar2,"cannot change arrayness of redeclared block",pcVar9,"");
  }
  TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)errorName);
  layoutObjectCheck(this,(TSourceLoc *)newTypeList_local,(TSymbol *)errorName);
  pTVar18 = (TType *)(**(code **)(*(long *)errorName + 0x60))();
  bVar3 = isIoResizeArray(this,pTVar18);
  if (bVar3) {
    std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::push_back
              (&(this->ioArraySymbolResizeList).
                super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>,
               (value_type *)&errorName);
    checkIoArraysConsistency(this,(TSourceLoc *)newTypeList_local,true);
  }
  else {
    plVar19 = (long *)(**(code **)(*(long *)errorName + 0x60))();
    uVar16 = (**(code **)(*plVar19 + 0xe8))();
    pTVar2 = newTypeList_local;
    if ((uVar16 & 1) != 0) {
      pTVar18 = (TType *)(**(code **)(*(long *)errorName + 0x68))();
      fixIoArraySize(this,(TSourceLoc *)pTVar2,pTVar18);
    }
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])(this,errorName)
  ;
  return;
}

Assistant:

void TParseContext::redeclareBuiltinBlock(const TSourceLoc& loc, TTypeList& newTypeList, const TString& blockName,
    const TString* instanceName, TArraySizes* arraySizes)
{
    const char* feature = "built-in block redeclaration";
    profileRequires(loc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, feature);
    profileRequires(loc, ~EEsProfile, 410, E_GL_ARB_separate_shader_objects, feature);

    if (blockName != "gl_PerVertex" && blockName != "gl_PerFragment" &&
        blockName != "gl_MeshPerVertexNV" && blockName != "gl_MeshPerPrimitiveNV" &&
        blockName != "gl_MeshPerVertexEXT" && blockName != "gl_MeshPerPrimitiveEXT") {
        error(loc, "cannot redeclare block: ", "block declaration", blockName.c_str());
        return;
    }

    // Redeclaring a built-in block...

    if (instanceName && ! builtInName(*instanceName)) {
        error(loc, "cannot redeclare a built-in block with a user name", instanceName->c_str(), "");
        return;
    }

    // Blocks with instance names are easy to find, lookup the instance name,
    // Anonymous blocks need to be found via a member.
    bool builtIn;
    TSymbol* block;
    if (instanceName)
        block = symbolTable.find(*instanceName, &builtIn);
    else
        block = symbolTable.find(newTypeList.front().type->getFieldName(), &builtIn);

    // If the block was not found, this must be a version/profile/stage
    // that doesn't have it, or the instance name is wrong.
    const char* errorName = instanceName ? instanceName->c_str() : newTypeList.front().type->getFieldName().c_str();
    if (! block) {
        error(loc, "no declaration found for redeclaration", errorName, "");
        return;
    }
    // Built-in blocks cannot be redeclared more than once, which if happened,
    // we'd be finding the already redeclared one here, rather than the built in.
    if (! builtIn) {
        error(loc, "can only redeclare a built-in block once, and before any use", blockName.c_str(), "");
        return;
    }

    // Copy the block to make a writable version, to insert into the block table after editing.
    block = symbolTable.copyUpDeferredInsert(block);

    if (block->getType().getBasicType() != EbtBlock) {
        error(loc, "cannot redeclare a non block as a block", errorName, "");
        return;
    }

    // Fix XFB stuff up, it applies to the order of the redeclaration, not
    // the order of the original members.
    if (currentBlockQualifier.storage == EvqVaryingOut && globalOutputDefaults.hasXfbBuffer()) {
        if (!currentBlockQualifier.hasXfbBuffer())
            currentBlockQualifier.layoutXfbBuffer = globalOutputDefaults.layoutXfbBuffer;
        if (!currentBlockQualifier.hasStream())
            currentBlockQualifier.layoutStream = globalOutputDefaults.layoutStream;
        fixXfbOffsets(currentBlockQualifier, newTypeList);
    }

    // Edit and error check the container against the redeclaration
    //  - remove unused members
    //  - ensure remaining qualifiers/types match

    TType& type = block->getWritableType();

    // if gl_PerVertex is redeclared for the purpose of passing through "gl_Position"
    // for passthrough purpose, the redeclared block should have the same qualifers as
    // the current one
    if (currentBlockQualifier.layoutPassthrough) {
        type.getQualifier().layoutPassthrough = currentBlockQualifier.layoutPassthrough;
        type.getQualifier().storage = currentBlockQualifier.storage;
        type.getQualifier().layoutStream = currentBlockQualifier.layoutStream;
        type.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
    }

    TTypeList::iterator member = type.getWritableStruct()->begin();
    size_t numOriginalMembersFound = 0;
    while (member != type.getStruct()->end()) {
        // look for match
        bool found = false;
        TTypeList::const_iterator newMember;
        TSourceLoc memberLoc;
        memberLoc.init();
        for (newMember = newTypeList.begin(); newMember != newTypeList.end(); ++newMember) {
            if (member->type->getFieldName() == newMember->type->getFieldName()) {
                found = true;
                memberLoc = newMember->loc;
                break;
            }
        }

        if (found) {
            ++numOriginalMembersFound;
            // - ensure match between redeclared members' types
            // - check for things that can't be changed
            // - update things that can be changed
            TType& oldType = *member->type;
            const TType& newType = *newMember->type;
            if (! newType.sameElementType(oldType))
                error(memberLoc, "cannot redeclare block member with a different type", member->type->getFieldName().c_str(), "");
            if (oldType.isArray() != newType.isArray())
                error(memberLoc, "cannot change arrayness of redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && ! oldType.sameArrayness(newType) && oldType.isSizedArray())
                error(memberLoc, "cannot change array size of redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && newType.isArray())
                arrayLimitCheck(loc, member->type->getFieldName(), newType.getOuterArraySize());
            if (oldType.getQualifier().isPerView() && ! newType.getQualifier().isPerView())
                error(memberLoc, "missing perviewNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && newType.getQualifier().isPerView())
                error(memberLoc, "cannot add perviewNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (newType.getQualifier().isPerView()) {
                if (oldType.getArraySizes()->getNumDims() != newType.getArraySizes()->getNumDims())
                    error(memberLoc, "cannot change arrayness of redeclared block member", member->type->getFieldName().c_str(), "");
                else if (! newType.isUnsizedArray() && newType.getOuterArraySize() != resources.maxMeshViewCountNV)
                    error(loc, "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized", "[]", "");
                else if (newType.getArraySizes()->getNumDims() == 2) {
                    int innerDimSize = newType.getArraySizes()->getDimSize(1);
                    arrayLimitCheck(memberLoc, member->type->getFieldName(), innerDimSize);
                    oldType.getArraySizes()->setDimSize(1, innerDimSize);
                }
            }
            if (oldType.getQualifier().isPerPrimitive() && ! newType.getQualifier().isPerPrimitive())
                error(memberLoc, "missing perprimitiveNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerPrimitive() && newType.getQualifier().isPerPrimitive())
                error(memberLoc, "cannot add perprimitiveNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().isMemory())
                error(memberLoc, "cannot add memory qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().hasNonXfbLayout())
                error(memberLoc, "cannot add non-XFB layout to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().patch)
                error(memberLoc, "cannot add patch to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().hasXfbBuffer() &&
                newType.getQualifier().layoutXfbBuffer != currentBlockQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
            if (newType.getQualifier().hasStream() &&
                newType.getQualifier().layoutStream != currentBlockQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_stream", "");
            oldType.getQualifier().centroid = newType.getQualifier().centroid;
            oldType.getQualifier().sample = newType.getQualifier().sample;
            oldType.getQualifier().invariant = newType.getQualifier().invariant;
            oldType.getQualifier().noContraction = newType.getQualifier().noContraction;
            oldType.getQualifier().smooth = newType.getQualifier().smooth;
            oldType.getQualifier().flat = newType.getQualifier().flat;
            oldType.getQualifier().nopersp = newType.getQualifier().nopersp;
            oldType.getQualifier().layoutXfbOffset = newType.getQualifier().layoutXfbOffset;
            oldType.getQualifier().layoutXfbBuffer = newType.getQualifier().layoutXfbBuffer;
            oldType.getQualifier().layoutXfbStride = newType.getQualifier().layoutXfbStride;
            if (oldType.getQualifier().layoutXfbOffset != TQualifier::layoutXfbBufferEnd) {
                // If any member has an xfb_offset, then the block's xfb_buffer inherents current xfb_buffer,
                // and for xfb processing, the member needs it as well, along with xfb_stride.
                type.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
                oldType.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
            }
            if (oldType.isUnsizedArray() && newType.isSizedArray())
                oldType.changeOuterArraySize(newType.getOuterArraySize());

            //  check and process the member's type, which will include managing xfb information
            layoutTypeCheck(loc, oldType);

            // go to next member
            ++member;
        } else {
            // For missing members of anonymous blocks that have been redeclared,
            // hide the original (shared) declaration.
            // Instance-named blocks can just have the member removed.
            if (instanceName)
                member = type.getWritableStruct()->erase(member);
            else {
                member->type->hideMember();
                ++member;
            }
        }
    }

    if (spvVersion.vulkan > 0) {
        // ...then streams apply to built-in blocks, instead of them being only on stream 0
        type.getQualifier().layoutStream = currentBlockQualifier.layoutStream;
    }

    if (numOriginalMembersFound < newTypeList.size())
        error(loc, "block redeclaration has extra members", blockName.c_str(), "");
    if (type.isArray() != (arraySizes != nullptr) ||
        (type.isArray() && arraySizes != nullptr && type.getArraySizes()->getNumDims() != arraySizes->getNumDims()))
        error(loc, "cannot change arrayness of redeclared block", blockName.c_str(), "");
    else if (type.isArray()) {
        // At this point, we know both are arrays and both have the same number of dimensions.

        // It is okay for a built-in block redeclaration to be unsized, and keep the size of the
        // original block declaration.
        if (!arraySizes->isSized() && type.isSizedArray())
            arraySizes->changeOuterSize(type.getOuterArraySize());

        // And, okay to be giving a size to the array, by the redeclaration
        if (!type.isSizedArray() && arraySizes->isSized())
            type.changeOuterArraySize(arraySizes->getOuterSize());

        // Now, they must match in all dimensions.
        if (type.isSizedArray() && *type.getArraySizes() != *arraySizes)
            error(loc, "cannot change array size of redeclared block", blockName.c_str(), "");
    }

    symbolTable.insert(*block);

    // Check for general layout qualifier errors
    layoutObjectCheck(loc, *block);

    // Tracking for implicit sizing of array
    if (isIoResizeArray(block->getType())) {
        ioArraySymbolResizeList.push_back(block);
        checkIoArraysConsistency(loc, true);
    } else if (block->getType().isArray())
        fixIoArraySize(loc, block->getWritableType());

    // Save it in the AST for linker use.
    trackLinkage(*block);
}